

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsst.cpp
# Opt level: O2

void duckdb::FSSTStorage::Compress(CompressionState *state_p,Vector *scan_vector,idx_t count)

{
  size_type __n;
  uchar *compressed_string;
  anon_struct_16_3_d7536bce_for_pointer uncompressed_string;
  reference ppuVar1;
  reference output;
  reference pvVar2;
  reference strOut;
  size_t sVar3;
  ulong uVar4;
  FatalException *pFVar5;
  idx_t i_1;
  uint *puVar6;
  pointer pcVar7;
  pointer pcVar8;
  idx_t i;
  ulong uVar9;
  size_type __n_00;
  size_type __n_01;
  allocator_type local_139;
  FSSTCompressionState *local_138;
  ulong local_130;
  string local_128;
  reference local_108;
  duckdb_fsst_encoder_t *local_100;
  vector<unsigned_long,_true> sizes_out;
  vector<unsigned_char_*,_true> strings_out;
  vector<unsigned_char_*,_true> strings_in;
  vector<unsigned_long,_true> sizes_in;
  vector<unsigned_char,_true> compress_buffer;
  UnifiedVectorFormat vdata;
  
  local_138 = (FSSTCompressionState *)state_p;
  UnifiedVectorFormat::UnifiedVectorFormat(&vdata);
  local_130 = count;
  Vector::ToUnifiedFormat(scan_vector,count,&vdata);
  sizes_in.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  sizes_in.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  sizes_in.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  strings_in.super_vector<unsigned_char_*,_std::allocator<unsigned_char_*>_>.
  super__Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  strings_in.super_vector<unsigned_char_*,_std::allocator<unsigned_char_*>_>.
  super__Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  strings_in.super_vector<unsigned_char_*,_std::allocator<unsigned_char_*>_>.
  super__Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  __n_00 = 0;
  pcVar8 = (pointer)0x0;
  for (uVar9 = 0; local_130 != uVar9; uVar9 = uVar9 + 1) {
    uVar4 = uVar9;
    if ((vdata.sel)->sel_vector != (sel_t *)0x0) {
      uVar4 = (ulong)(vdata.sel)->sel_vector[uVar9];
    }
    if ((vdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
         (unsigned_long *)0x0) ||
       ((vdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask[uVar4 >> 6] >>
         (uVar4 & 0x3f) & 1) != 0)) {
      pcVar7 = (pointer)(ulong)*(uint *)(vdata.data + uVar4 * 0x10);
      if (pcVar7 != (pointer)0x0) {
        local_128._M_dataplus._M_p = pcVar7;
        ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<unsigned_long>
                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&sizes_in,
                   (unsigned_long *)&local_128);
        puVar6 = (uint *)(vdata.data + uVar4 * 0x10);
        if (*puVar6 < 0xd) {
          local_128._M_dataplus._M_p = (pointer)(puVar6 + 1);
        }
        else {
          local_128._M_dataplus._M_p = *(pointer *)(puVar6 + 2);
        }
        ::std::vector<unsigned_char*,std::allocator<unsigned_char*>>::emplace_back<unsigned_char*>
                  ((vector<unsigned_char*,std::allocator<unsigned_char*>> *)&strings_in,
                   (uchar **)&local_128);
        __n_00 = __n_00 + 1;
        pcVar8 = pcVar8 + (long)pcVar7;
      }
    }
  }
  if (__n_00 == 0) {
    for (uVar9 = 0; local_130 != uVar9; uVar9 = uVar9 + 1) {
      uVar4 = uVar9;
      if ((vdata.sel)->sel_vector != (sel_t *)0x0) {
        uVar4 = (ulong)(vdata.sel)->sel_vector[uVar9];
      }
      if ((vdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
           (unsigned_long *)0x0) ||
         ((vdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask[uVar4 >> 6] >>
           (uVar4 & 0x3f) & 1) != 0)) {
        if (*(int *)(vdata.data + uVar4 * 0x10) != 0) {
          pFVar5 = (FatalException *)__cxa_allocate_exception(0x10);
          ::std::__cxx11::string::string
                    ((string *)&local_128,
                     "FSST: no encoder found even though there are values to encode",
                     (allocator *)&strings_out);
          FatalException::FatalException(pFVar5,&local_128);
          __cxa_throw(pFVar5,&FatalException::typeinfo,::std::runtime_error::~runtime_error);
        }
        FSSTCompressionState::AddEmptyString(local_138);
      }
      else {
        FSSTCompressionState::AddNull(local_138);
      }
    }
  }
  else {
    local_128._M_dataplus._M_p = (pointer)0x0;
    ::std::vector<unsigned_char_*,_std::allocator<unsigned_char_*>_>::vector
              (&strings_out.super_vector<unsigned_char_*,_std::allocator<unsigned_char_*>_>,__n_00,
               (value_type *)&local_128,(allocator_type *)&sizes_out);
    local_128._M_dataplus._M_p = (pointer)0x0;
    ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&sizes_out,__n_00,
               (value_type_conflict2 *)&local_128,(allocator_type *)&compress_buffer);
    __n = (long)pcVar8 * 2 + 7;
    local_128._M_dataplus._M_p = local_128._M_dataplus._M_p & 0xffffffffffffff00;
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              (&compress_buffer.super_vector<unsigned_char,_std::allocator<unsigned_char>_>,__n,
               (value_type_conflict4 *)&local_128,&local_139);
    local_100 = local_138->fsst_encoder;
    local_108 = vector<unsigned_long,_true>::get<true>(&sizes_in,0);
    ppuVar1 = vector<unsigned_char_*,_true>::get<true>(&strings_in,0);
    output = vector<unsigned_char,_true>::get<true>(&compress_buffer,0);
    pvVar2 = vector<unsigned_long,_true>::get<true>(&sizes_out,0);
    strOut = vector<unsigned_char_*,_true>::get<true>(&strings_out,0);
    sVar3 = duckdb_fsst_compress(local_100,__n_00,local_108,ppuVar1,__n,output,pvVar2,strOut);
    if (sVar3 != __n_00) {
      pFVar5 = (FatalException *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&local_128,"FSST compression failed to compress all strings",
                 (allocator *)&local_139);
      FatalException::FatalException(pFVar5,&local_128);
      __cxa_throw(pFVar5,&FatalException::typeinfo,::std::runtime_error::~runtime_error);
    }
    __n_01 = 0;
    for (uVar9 = 0; local_130 != uVar9; uVar9 = uVar9 + 1) {
      uVar4 = uVar9;
      if ((vdata.sel)->sel_vector != (sel_t *)0x0) {
        uVar4 = (ulong)(vdata.sel)->sel_vector[uVar9];
      }
      if ((vdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
           (unsigned_long *)0x0) ||
         ((vdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask[uVar4 >> 6] >>
           (uVar4 & 0x3f) & 1) != 0)) {
        if (*(int *)(vdata.data + uVar4 * 0x10) == 0) {
          FSSTCompressionState::AddEmptyString(local_138);
        }
        else {
          uncompressed_string =
               ((anon_union_16_2_67f50693_for_value *)(vdata.data + uVar4 * 0x10))->pointer;
          ppuVar1 = vector<unsigned_char_*,_true>::get<true>(&strings_out,__n_01);
          compressed_string = *ppuVar1;
          pvVar2 = vector<unsigned_long,_true>::get<true>(&sizes_out,__n_01);
          FSSTCompressionState::UpdateState
                    (local_138,(string_t)uncompressed_string,compressed_string,*pvVar2);
          __n_01 = __n_01 + 1;
        }
      }
      else {
        FSSTCompressionState::AddNull(local_138);
      }
    }
    ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&compress_buffer);
    ::std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
              ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&sizes_out);
    ::std::_Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>::~_Vector_base
              ((_Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_> *)&strings_out);
  }
  ::std::_Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>::~_Vector_base
            ((_Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_> *)&strings_in);
  ::std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&sizes_in);
  UnifiedVectorFormat::~UnifiedVectorFormat(&vdata);
  return;
}

Assistant:

void FSSTStorage::Compress(CompressionState &state_p, Vector &scan_vector, idx_t count) {
	auto &state = state_p.Cast<FSSTCompressionState>();

	// Get vector data
	UnifiedVectorFormat vdata;
	scan_vector.ToUnifiedFormat(count, vdata);
	auto data = UnifiedVectorFormat::GetData<string_t>(vdata);

	// Collect pointers to strings to compress
	vector<size_t> sizes_in;
	vector<unsigned char *> strings_in;
	size_t total_size = 0;
	idx_t total_count = 0;
	for (idx_t i = 0; i < count; i++) {
		auto idx = vdata.sel->get_index(i);

		// Note: we treat nulls and empty strings the same
		if (!vdata.validity.RowIsValid(idx) || data[idx].GetSize() == 0) {
			continue;
		}

		total_count++;
		total_size += data[idx].GetSize();
		sizes_in.push_back(data[idx].GetSize());
		strings_in.push_back((unsigned char *)data[idx].GetData()); // NOLINT
	}

	// Only Nulls or empty strings in this vector, nothing to compress
	if (total_count == 0) {
		for (idx_t i = 0; i < count; i++) {
			auto idx = vdata.sel->get_index(i);
			if (!vdata.validity.RowIsValid(idx)) {
				state.AddNull();
			} else if (data[idx].GetSize() == 0) {
				state.AddEmptyString();
			} else {
				throw FatalException("FSST: no encoder found even though there are values to encode");
			}
		}
		return;
	}

	// Compress buffers
	size_t compress_buffer_size = MaxValue<size_t>(total_size * 2 + 7, 1);
	vector<unsigned char *> strings_out(total_count, nullptr);
	vector<size_t> sizes_out(total_count, 0);
	vector<unsigned char> compress_buffer(compress_buffer_size, 0);

	auto res = duckdb_fsst_compress(
	    state.fsst_encoder,   /* IN: encoder obtained from duckdb_fsst_create(). */
	    total_count,          /* IN: number of strings in batch to compress. */
	    &sizes_in[0],         /* IN: byte-lengths of the inputs */
	    &strings_in[0],       /* IN: input string start pointers. */
	    compress_buffer_size, /* IN: byte-length of output buffer. */
	    &compress_buffer[0],  /* OUT: memory buffer to put the compressed strings in (one after the other). */
	    &sizes_out[0],        /* OUT: byte-lengths of the compressed strings. */
	    &strings_out[0]       /* OUT: output string start pointers. Will all point into [output,output+size). */
	);

	if (res != total_count) {
		throw FatalException("FSST compression failed to compress all strings");
	}

	// Push the compressed strings to the compression state one by one
	idx_t compressed_idx = 0;
	for (idx_t i = 0; i < count; i++) {
		auto idx = vdata.sel->get_index(i);
		if (!vdata.validity.RowIsValid(idx)) {
			state.AddNull();
		} else if (data[idx].GetSize() == 0) {
			state.AddEmptyString();
		} else {
			state.UpdateState(data[idx], strings_out[compressed_idx], sizes_out[compressed_idx]);
			compressed_idx++;
		}
	}
}